

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O0

void __thiscall jsonip::semantic_state::semantic_state(semantic_state *this,state_t *initial_state)

{
  state_t *initial_state_local;
  semantic_state *this_local;
  
  std::
  vector<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
  ::vector(&this->state);
  std::
  vector<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
  ::push_back(&this->state,initial_state);
  return;
}

Assistant:

semantic_state(const state_t& initial_state)
        {
            state.push_back(initial_state);
        }